

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>
           *this,bit_array *x,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          first,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                last,double kappa,double delta,double theta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  bool bVar6;
  undefined8 uVar7;
  bool bVar8;
  undefined8 extraout_RAX;
  long lVar9;
  long lVar10;
  _Head_base<0UL,_int_*,_false> _Var11;
  uint uVar12;
  type it;
  int *piVar13;
  rc_data *ret;
  rc_data *__first;
  long lVar14;
  tuple<int_*,_std::default_delete<int[]>_> tVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  rc_data *__last;
  long lVar20;
  long lVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined8 in_XMM4_Qb;
  double local_c0;
  undefined1 local_90 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_80;
  long local_78;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_70;
  pair<int,_int> *local_68;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_60;
  pair<int,_int> *local_58;
  long local_50;
  long local_48;
  unique_ptr<int[],_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  if (first._M_current != last._M_current) {
    local_70._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )((long)this + 8);
    dVar22 = kappa / (1.0 - kappa);
    local_68 = last._M_current;
    local_60._M_head_impl = (col_value *)theta;
    do {
      if (*(int *)(this + 0x80) <= (first._M_current)->first) {
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  ();
LAB_0018321e:
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      local_78 = (long)(first._M_current)->first;
      local_58 = first._M_current;
      sparse_matrix<int>::row
                ((sparse_matrix<int> *)local_90,
                 (int)local_70._M_t.
                      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                      _M_head_impl);
      if (local_90._8_8_ != local_90._0_8_) {
        lVar21 = *(long *)(this + 0x68);
        _Var11._M_head_impl = (int *)local_90._8_8_;
        do {
          *(double *)(lVar21 + (long)*_Var11._M_head_impl * 8) =
               (double)local_60._M_head_impl * *(double *)(lVar21 + (long)*_Var11._M_head_impl * 8);
          _Var11._M_head_impl = _Var11._M_head_impl + 8;
        } while (_Var11._M_head_impl != (int *)local_90._0_8_);
      }
      if (local_90._8_8_ == local_90._0_8_) {
        uVar19 = 0;
      }
      else {
        uVar19 = 0;
        piVar13 = (int *)local_90._8_8_;
        do {
          sparse_matrix<int>::column
                    ((sparse_matrix<int> *)&local_40,
                     (int)local_70._M_t.
                          super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                          .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                          _M_head_impl);
          if ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)local_38._M_head_impl ==
              (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
              local_40._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl) {
            local_c0 = 0.0;
          }
          else {
            auVar32 = ZEXT864(0) << 0x40;
            do {
              auVar24._0_8_ =
                   (double)*(int *)(*(long *)(this + 0x48) + (long)*local_38._M_head_impl * 4);
              auVar24._8_8_ = in_XMM4_Qb;
              auVar1._8_8_ = 0;
              auVar1._0_8_ = *(ulong *)(*(long *)(this + 0x68) + (long)*local_38._M_head_impl * 8);
              auVar1 = vfmadd231sd_fma(auVar32._0_16_,auVar24,auVar1);
              auVar32 = ZEXT1664(auVar1);
              local_38._M_head_impl = local_38._M_head_impl + 2;
            } while ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                     local_38._M_head_impl !=
                     (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                     local_40._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                     super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                     super__Head_base<0UL,_int_*,_false>._M_head_impl);
            local_c0 = auVar1._0_8_;
          }
          lVar21 = *(long *)(this + 0x50);
          lVar20 = uVar19 * 0x10;
          *(int *)(lVar21 + 8 + lVar20) = (int)uVar19;
          *(undefined4 *)(lVar21 + 0xc + lVar20) =
               *(undefined4 *)(*(long *)(this + 0x48) + (long)*piVar13 * 4);
          dVar23 = quadratic_cost_type<double>::operator()
                             (*(quadratic_cost_type<double> **)(this + 0x70),
                              *(int *)(local_90._8_8_ + 4),x);
          *(double *)(*(long *)(this + 0x50) + lVar20) = dVar23 - local_c0;
          piVar13 = piVar13 + 2;
          uVar19 = uVar19 + 1;
        } while (piVar13 != (int *)local_90._0_8_);
      }
      uVar17 = (uint)uVar19;
      tVar15.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)(uVar19 & 0xffffffff);
      if (1 < uVar17) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)this;
        __first = *(rc_data **)(this + 0x50);
        std::
        __introsort_loop<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + (long)tVar15.
                                           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>
                                           .super__Head_base<0UL,_int_*,_false>._M_head_impl,
                   (int)LZCOUNT(tVar15.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                super__Head_base<0UL,_int_*,_false>._M_head_impl) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + (long)tVar15.
                                           super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>
                                           .super__Head_base<0UL,_int_*,_false>._M_head_impl);
        __last = __first + 1;
        lVar21 = (long)tVar15.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl * 0x10 + -0x10;
        do {
          if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
            std::
            shuffle<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,__last,__g);
            __first = __last;
          }
          __last = __last + 1;
          lVar21 = lVar21 + -0x10;
        } while (lVar21 != 0);
        std::
        shuffle<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,__last,__g);
      }
      lVar21 = local_78;
      local_80._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl =
           (tuple<int_*,_std::default_delete<int[]>_>)
           (tuple<int_*,_std::default_delete<int[]>_>)
           tVar15.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
      if (*(int *)(*(long *)(this + 0x58) + local_78 * 0xc) < 1) {
        iVar18 = 0;
        uVar19 = 0xffffffff;
      }
      else {
        lVar20 = 0;
        iVar18 = 0;
        uVar16 = 0xffffffffffffffff;
        do {
          uVar7 = local_90._8_8_;
          uVar19 = uVar16 + 1;
          iVar18 = iVar18 + *(int *)(*(long *)(this + 0x50) + 0xc + lVar20);
          iVar5 = *(int *)(*(long *)(this + 0x58) + lVar21 * 0xc);
          lVar14 = (long)*(int *)(*(long *)(this + 0x50) + 8 + lVar20);
          bit_array_impl::set(&x->super_bit_array_impl,
                              *(int *)(local_90._8_8_ + (lVar14 * 2 + 1) * 4));
          auVar29._8_8_ = 0;
          auVar29._0_8_ = dVar22;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = delta;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = *(double *)(*(long *)(this + 0x50) + lVar20) * 0.5;
          auVar1 = vfmadd213sd_fma(auVar25,auVar29,auVar2);
          *(double *)(*(long *)(this + 0x68) + (long)*(int *)(uVar7 + lVar14 * 2 * 4) * 8) =
               auVar1._0_8_ +
               *(double *)(*(long *)(this + 0x68) + (long)*(int *)(uVar7 + lVar14 * 2 * 4) * 8);
          if (iVar5 <= iVar18) break;
          lVar20 = lVar20 + 0x10;
          bVar8 = (long)uVar16 < (long)(int)uVar17 + -2;
          uVar16 = uVar19;
        } while (bVar8);
        uVar17 = (uint)local_80._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl;
      }
      uVar12 = (uint)uVar19;
      if (iVar18 < *(int *)(*(long *)(this + 0x58) + lVar21 * 0xc)) {
        bVar8 = false;
      }
      else {
        bVar8 = iVar18 <= *(int *)(*(long *)(this + 0x58) + lVar21 * 0xc + 4);
      }
      if (((int)(uVar12 + 1) < (int)uVar17) && (bVar8)) {
        local_48 = (long)(int)uVar17;
        lVar20 = (long)(int)uVar12 << 4;
        lVar14 = (long)(int)uVar12 + 2;
        do {
          uVar7 = local_90._8_8_;
          lVar10 = *(long *)(this + 0x50);
          iVar18 = iVar18 + *(int *)(lVar10 + 0x1c + lVar20);
          if (iVar18 < *(int *)(*(long *)(this + 0x58) + lVar21 * 0xc)) {
            bVar8 = false;
          }
          else {
            bVar8 = iVar18 <= *(int *)(*(long *)(this + 0x58) + lVar21 * 0xc + 4);
          }
          lVar9 = (long)*(int *)(lVar10 + 0x18 + lVar20);
          if (bVar8) {
            dVar23 = *(double *)(lVar10 + 0x10 + lVar20);
            if ((dVar23 != 0.0) || (NAN(dVar23))) {
              bVar8 = dVar23 < 0.0;
            }
            else {
              local_50 = lVar9;
              dVar23 = std::
                       generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                 (*(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                    **)this);
              bVar8 = dVar23 < 0.5;
              lVar9 = local_50;
            }
          }
          if (bVar8) {
            bit_array_impl::set(&x->super_bit_array_impl,*(int *)(uVar7 + (lVar9 * 2 + 1) * 4));
            lVar10 = *(long *)(this + 0x68);
            auVar30._8_8_ = 0;
            auVar30._0_8_ = dVar22;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = delta;
            auVar26._8_8_ = 0;
            auVar26._0_8_ = *(double *)(*(long *)(this + 0x50) + 0x10 + lVar20) * 0.5;
            auVar1 = vfmadd213sd_fma(auVar26,auVar30,auVar3);
            lVar9 = (long)*(int *)(uVar7 + lVar9 * 2 * 4);
            dVar23 = auVar1._0_8_ + *(double *)(lVar10 + lVar9 * 8);
          }
          else {
            bit_array_impl::unset(&x->super_bit_array_impl,*(int *)(uVar7 + (lVar9 * 2 + 1) * 4));
            lVar10 = *(long *)(this + 0x68);
            auVar31._8_8_ = 0;
            auVar31._0_8_ = dVar22;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = delta;
            auVar27._8_8_ = 0;
            auVar27._0_8_ = *(double *)(*(long *)(this + 0x50) + 0x10 + lVar20) * 0.5;
            auVar1 = vfmadd213sd_fma(auVar27,auVar31,auVar4);
            lVar9 = (long)*(int *)(uVar7 + lVar9 * 2 * 4);
            dVar23 = *(double *)(lVar10 + lVar9 * 8) - auVar1._0_8_;
          }
          *(double *)(lVar10 + lVar9 * 8) = dVar23;
          bVar6 = lVar14 < local_48;
          uVar12 = (int)uVar19 + 1;
          uVar19 = (ulong)uVar12;
          lVar20 = lVar20 + 0x10;
          lVar14 = lVar14 + 1;
        } while ((bool)(bVar6 & bVar8));
      }
      if ((int)(uVar12 + 1) <
          (int)local_80._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl) {
        lVar21 = (long)(int)uVar12 << 4;
        iVar18 = ~uVar12 + (int)local_80._M_t.
                                super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                super__Head_base<0UL,_int_*,_false>._M_head_impl;
        do {
          uVar7 = local_90._8_8_;
          lVar20 = (long)*(int *)(*(long *)(this + 0x50) + 0x18 + lVar21);
          bit_array_impl::unset
                    (&x->super_bit_array_impl,*(int *)(local_90._8_8_ + (lVar20 * 2 + 1) * 4));
          auVar34._8_8_ = 0;
          auVar34._0_8_ = dVar22;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = delta;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = *(double *)(*(long *)(this + 0x50) + 0x10 + lVar21) * 0.5;
          auVar1 = vfmadd213sd_fma(auVar28,auVar34,auVar33);
          *(double *)(*(long *)(this + 0x68) + (long)*(int *)(uVar7 + lVar20 * 2 * 4) * 8) =
               *(double *)(*(long *)(this + 0x68) + (long)*(int *)(uVar7 + lVar20 * 2 * 4) * 8) -
               auVar1._0_8_;
          lVar21 = lVar21 + 0x10;
          iVar18 = iVar18 + -1;
        } while (iVar18 != 0);
      }
      bVar8 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>,baryonyx::bit_array>
                        ((solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                          *)this,(int)local_78,x);
      if (!bVar8) goto LAB_0018321e;
      first._M_current = local_58 + 1;
    } while (first._M_current != local_68);
  }
  return false;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }